

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O1

void bcache_print_items(void)

{
  byte bVar1;
  char cVar2;
  fnamedic_item *pfVar3;
  avl_node *paVar4;
  undefined4 uVar5;
  int iVar6;
  avl_node *node;
  ulong uVar7;
  list_elem *plVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  string ss_local;
  string ss;
  size_t scores_local [100];
  size_t scores [100];
  char tmp_buf [4096];
  
  ss._M_dataplus._M_p = (pointer)&ss.field_2;
  ss._M_string_length = 0;
  ss.field_2._M_local_buf[0] = '\0';
  ss_local._M_dataplus._M_p = (pointer)&ss_local.field_2;
  ss_local._M_string_length = 0;
  ss_local.field_2._M_local_buf[0] = '\0';
  memset(scores,0,800);
  builtin_strncpy(tmp_buf," === Block cache statistics summary ===\n",0x29);
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"%3s %20s (%6s)(%6s)(c%6s d%6s)","No","Filename","#Pages","#Evict","Clean",
           "Dirty");
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"%6s%6s","Doc","Node");
  std::__cxx11::string::append((char *)&ss_local);
  uVar10 = 0;
  do {
    snprintf(tmp_buf,0xfff,"   [%d] ",uVar10 & 0xffffffff);
    std::__cxx11::string::append((char *)&ss_local);
    uVar10 = uVar10 + 1;
  } while (uVar10 == 1);
  tmp_buf[0] = '\n';
  tmp_buf[1] = '\0';
  std::__cxx11::string::append((char *)&ss_local);
  iVar6 = pthread_rwlock_rdlock((pthread_rwlock_t *)&filelist_lock);
  if (iVar6 != 0) {
    bcache_print_items_cold_1();
  }
  if (num_files == 0) {
    uVar10 = 0;
    uVar13 = 0;
    uVar16 = 0;
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    uVar16 = 0;
    uVar13 = 0;
    uVar10 = 0;
    do {
      pfVar3 = file_list[uVar15];
      memset(scores_local,0,800);
      if (pfVar3->num_shards == 0) {
        lVar12 = 0;
        lVar9 = 0;
        uVar11 = 0;
        uVar14 = 0;
      }
      else {
        uVar7 = 0;
        uVar14 = 0;
        uVar11 = 0;
        lVar9 = 0;
        lVar12 = 0;
        do {
          pthread_spin_lock(&pfVar3->shards[uVar7].lock);
          plVar8 = pfVar3->shards[uVar7].cleanlist.head;
          node = avl_first(&pfVar3->shards[uVar7].tree);
          if (plVar8 != (list_elem *)0x0) {
            do {
              bVar1 = *(byte *)((long)&plVar8[1].prev + 1);
              scores[bVar1] = scores[bVar1] + 1;
              scores_local[bVar1] = scores_local[bVar1] + 1;
              cVar2 = *(char *)((long)plVar8[-2].prev + (long)bcache_blocksize + -1);
              if (cVar2 == -0x23) {
                uVar11 = uVar11 + 1;
              }
              else if (cVar2 == -1) {
                uVar14 = uVar14 + 1;
              }
              plVar8 = plVar8->next;
              uVar16 = uVar16 + 1;
              lVar12 = lVar12 + 1;
            } while (plVar8 != (list_elem *)0x0);
          }
          for (; node != (avl_node *)0x0; node = avl_next(node)) {
            paVar4 = node[-1].right;
            bVar1 = *(byte *)((long)&paVar4[2].left + 1);
            scores[bVar1] = scores[bVar1] + 1;
            scores_local[bVar1] = scores_local[bVar1] + 1;
            cVar2 = *(char *)((long)paVar4->left + (long)bcache_blocksize + -1);
            if (cVar2 == -0x23) {
              uVar11 = uVar11 + 1;
            }
            else if (cVar2 == -1) {
              uVar14 = uVar14 + 1;
            }
            lVar9 = lVar9 + 1;
            uVar16 = uVar16 + 1;
          }
          pthread_spin_unlock(&pfVar3->shards[uVar7].lock);
          uVar7 = uVar7 + 1;
        } while (uVar7 < pfVar3->num_shards);
      }
      snprintf(tmp_buf,0xfff,"%3d %20s (%6d)(%6d)(c%6d d%6d)",(ulong)((int)uVar15 + 1),
               pfVar3->filename,(pfVar3->nitems).super___atomic_base<unsigned_long>._M_i,
               (pfVar3->nvictim).super___atomic_base<unsigned_long>._M_i,lVar12,lVar9);
      std::__cxx11::string::append((char *)&ss_local);
      snprintf(tmp_buf,0xfff,"%6d%6d",uVar11 & 0xffffffff,uVar14 & 0xffffffff);
      std::__cxx11::string::append((char *)&ss_local);
      lVar9 = 0;
      do {
        snprintf(tmp_buf,0xfff,"%6d ",(ulong)(uint)scores_local[lVar9]);
        std::__cxx11::string::append((char *)&ss_local);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 1);
      tmp_buf[0] = '\n';
      tmp_buf[1] = '\0';
      std::__cxx11::string::append((char *)&ss_local);
      if (4000 < ss_local._M_string_length + ss._M_string_length) {
        fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                     ,"bcache_print_items",0x64e,"%s",ss._M_dataplus._M_p);
        ss._M_string_length = 0;
        *ss._M_dataplus._M_p = '\0';
      }
      std::__cxx11::string::_M_append((char *)&ss,(ulong)ss_local._M_dataplus._M_p);
      uVar10 = uVar10 + uVar11;
      uVar13 = uVar13 + uVar14;
      uVar15 = uVar15 + 1;
      ss_local._M_string_length = 0;
      *ss_local._M_dataplus._M_p = '\0';
    } while (uVar15 < num_files);
  }
  iVar6 = pthread_rwlock_unlock((pthread_rwlock_t *)&filelist_lock);
  if (iVar6 != 0) {
    bcache_print_items_cold_2();
  }
  builtin_strncpy(tmp_buf," ===\n",6);
  uVar5 = tmp_buf._0_4_;
  tmp_buf._0_8_ = CONCAT44(tmp_buf._4_4_,uVar5);
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"%d files %d items\n",uVar15 & 0xffffffff,uVar16 & 0xffffffff);
  std::__cxx11::string::append((char *)&ss_local);
  uVar15 = 0;
  do {
    snprintf(tmp_buf,0xfff,"[%d]: %d\n",uVar15 & 0xffffffff,(ulong)(uint)scores[uVar15]);
    std::__cxx11::string::append((char *)&ss_local);
    uVar15 = uVar15 + 1;
  } while (uVar15 == 1);
  snprintf(tmp_buf,0xfff,"Documents: %d blocks\n",uVar10 & 0xffffffff);
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"Index nodes: %d blocks\n",uVar13 & 0xffffffff);
  std::__cxx11::string::append((char *)&ss_local);
  if (4000 < ss_local._M_string_length + ss._M_string_length) {
    fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                 ,"bcache_print_items",0x65f,"%s",ss._M_dataplus._M_p);
    ss._M_string_length = 0;
    *ss._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::_M_append((char *)&ss,(ulong)ss_local._M_dataplus._M_p);
  ss_local._M_string_length = 0;
  *ss_local._M_dataplus._M_p = '\0';
  fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
               ,"bcache_print_items",0x664,"%s",ss._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ss_local._M_dataplus._M_p != &ss_local.field_2) {
    operator_delete(ss_local._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ss._M_dataplus._M_p != &ss.field_2) {
    operator_delete(ss._M_dataplus._M_p);
  }
  return;
}

Assistant:

void bcache_print_items()
{
    std::string ss;
    std::string ss_local;
    char tmp_buf[4096];
    size_t n=1;
    size_t nfiles, nitems, nfileitems, nclean, ndirty;
    size_t scores[100], i, scores_local[100];
    size_t docs, bnodes;
    size_t docs_local, bnodes_local;
    uint8_t *ptr;

    nfiles = nitems = nfileitems = nclean = ndirty = 0;
    docs = bnodes = 0;
    memset(scores, 0, sizeof(size_t)*100);

    struct fnamedic_item *fname;
    struct bcache_item *item;
    struct dirty_item *dirty;
    struct list_elem *ee;
    struct avl_node *a;

    ADD2BUF(" === Block cache statistics summary ===\n");
    ADD2BUF("%3s %20s (%6s)(%6s)(c%6s d%6s)",
        "No", "Filename", "#Pages", "#Evict", "Clean", "Dirty");
#ifdef __CRC32
    ADD2BUF("%6s%6s", "Doc", "Node");
#endif
    for (i=0;i<=n;++i) {
        ADD2BUF("   [%d] ", (int)i);
    }
    ADD2BUF("\n");

    reader_lock(&filelist_lock);
    for (size_t idx = 0; idx < num_files; ++idx) {
        fname = file_list[idx];
        memset(scores_local, 0, sizeof(size_t)*100);
        nfileitems = nclean = ndirty = 0;
        docs_local = bnodes_local = 0;

        size_t i = 0;
        for (; i < fname->num_shards; ++i) {
            spin_lock(&fname->shards[i].lock);
            ee = list_begin(&fname->shards[i].cleanlist);
            a = avl_first(&fname->shards[i].tree);

            while(ee){
                item = _get_entry(ee, struct bcache_item, list_elem);
                scores[item->score]++;
                scores_local[item->score]++;
                nitems++;
                nfileitems++;
                nclean++;
#ifdef __CRC32
                ptr = (uint8_t*)item->addr + bcache_blocksize - 1;
                switch (*ptr) {
                case BLK_MARKER_BNODE:
                    bnodes_local++;
                    break;
                case BLK_MARKER_DOC:
                    docs_local++;
                    break;
                }
#endif
                ee = list_next(ee);
            }
            while(a){
                dirty = _get_entry(a, struct dirty_item, avl);
                item = dirty->item;
                scores[item->score]++;
                scores_local[item->score]++;
                nitems++;
                nfileitems++;
                ndirty++;
#ifdef __CRC32
                ptr = (uint8_t*)item->addr + bcache_blocksize - 1;
                switch (*ptr) {
                case BLK_MARKER_BNODE:
                    bnodes_local++;
                    break;
                case BLK_MARKER_DOC:
                    docs_local++;
                    break;
                }
#endif
                a = avl_next(a);
            }
            spin_unlock(&fname->shards[i].lock);
        }

        ADD2BUF("%3d %20s (%6d)(%6d)(c%6d d%6d)",
               (int)nfiles+1, fname->filename,
               (int)atomic_get_uint64_t(&fname->nitems),
               (int)atomic_get_uint64_t(&fname->nvictim),
               (int)nclean, (int)ndirty);
        ADD2BUF("%6d%6d", (int)docs_local, (int)bnodes_local);
        for (i=0;i<=n;++i){
            ADD2BUF("%6d ", (int)scores_local[i]);
        }
        ADD2BUF("\n");

        docs += docs_local;
        bnodes += bnodes_local;

        nfiles++;

        if (ss.size() + ss_local.size() > 4000) {
            BCACHE_LOG("%s", ss.c_str());
            ss.clear();
        }
        ss += ss_local;
        ss_local.clear();
    }
    reader_unlock(&filelist_lock);
    ADD2BUF(" ===\n");

    ADD2BUF("%d files %d items\n", (int)nfiles, (int)nitems);
    for (i=0;i<=n;++i){
        ADD2BUF("[%d]: %d\n", (int)i, (int)scores[i]);
    }
    ADD2BUF("Documents: %d blocks\n", (int)docs);
    ADD2BUF("Index nodes: %d blocks\n", (int)bnodes);

    if (ss.size() + ss_local.size() > 4000) {
        BCACHE_LOG("%s", ss.c_str());
        ss.clear();
    }
    ss += ss_local;
    ss_local.clear();
    BCACHE_LOG("%s", ss.c_str());
}